

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandRunTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  uint fVerbose;
  uint fFancy;
  char *pcVar4;
  char *pFileNames [4];
  
  pFileNames[2] = (char *)0x0;
  pFileNames[3] = (char *)0x0;
  pFileNames[0] = (char *)0x0;
  pFileNames[1] = (char *)0x0;
  fFancy = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"fvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x66) goto LAB_002262ae;
    fFancy = fFancy ^ 1;
  }
  if (0xfffffffb < (argc - globalUtilOptind) - 6U) {
    for (uVar3 = 0; (uint)(argc - globalUtilOptind) != uVar3; uVar3 = uVar3 + 1) {
      pFileNames[uVar3] = argv[(long)globalUtilOptind + uVar3];
    }
    Acb_NtkRunTest(pFileNames,fFancy,fVerbose);
    return 0;
  }
  Abc_Print(1,"Expecting two or three file names on the command line.\n");
LAB_002262ae:
  Abc_Print(-2,"usage: runtest [-fvh] <file1> <file2>\n");
  Abc_Print(-2,"\t           experimental simulation command\n");
  pcVar4 = "yes";
  pcVar2 = "yes";
  if (fFancy == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-f       : toggle using experimental feature [default = %s]\n",pcVar2);
  if (fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandRunTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Acb_NtkRunTest( char * pFileNames[4], int fFancy, int fVerbose );
    char * pFileNames[4] = {NULL};
    int c, fFancy = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fFancy ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc - globalUtilOptind < 2 || argc - globalUtilOptind > 5 )
    {
        Abc_Print( 1, "Expecting two or three file names on the command line.\n" );
        goto usage;
    }
    for ( c = 0; c < argc - globalUtilOptind; c++ )
        pFileNames[c] = argv[globalUtilOptind+c];
    Acb_NtkRunTest( pFileNames, fFancy, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: runtest [-fvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t           experimental simulation command\n" );
    Abc_Print( -2, "\t-f       : toggle using experimental feature [default = %s]\n",      fFancy? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}